

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

void __thiscall ADSBHubConnection::Stop(ADSBHubConnection *this,bool bWaitJoin)

{
  byte bVar1;
  bool bVar2;
  ssize_t sVar3;
  byte in_SIL;
  long in_RDI;
  LTChannel *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  long lVar4;
  undefined1 bWaitJoin_00;
  
  bVar1 = in_SIL & 1;
  lVar4 = in_RDI;
  bVar2 = LTChannel::isRunning((LTChannel *)0x1873c0);
  bWaitJoin_00 = (undefined1)((ulong)lVar4 >> 0x38);
  if (bVar2) {
    if (*(int *)(in_RDI + 0x88) < 3) {
      *(undefined4 *)(in_RDI + 0x88) = 3;
    }
    if ((*(int *)(in_RDI + 0x24c) == -1) ||
       (sVar3 = write(*(int *)(in_RDI + 0x24c),"STOP",4), sVar3 < 0)) {
      XPMP2::TCPConnection::Close((TCPConnection *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
    }
  }
  LTChannel::Stop(unaff_retaddr,(bool)bWaitJoin_00);
  return;
}

Assistant:

void ADSBHubConnection::Stop (bool bWaitJoin)
{
    if (isRunning()) {
        if (eThrStatus < THR_STOP)
            eThrStatus = THR_STOP;          // indicate to the thread that it has to end itself
        
#if APL == 1 || LIN == 1
        // Mac/Lin: Try writing something to the self-pipe to stop gracefully
        if (streamPipe[1] == INVALID_SOCKET ||
            write(streamPipe[1], "STOP", 4) < 0)
        {
            // if the self-pipe didn't work:
#endif
            // close all connections, this will also break out of all
            // blocking calls for receiving message and hence terminate the threads
            tcpStream.Close();
#if APL == 1 || LIN == 1
        }
#endif
    }
    
    // Parent class processing: Wait for the thread to join
    LTFlightDataChannel::Stop(bWaitJoin);
}